

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

bool __thiscall BackwardPass::ProcessByteCodeUsesInstr(BackwardPass *this,Instr *instr)

{
  Phase PVar1;
  Type TVar2;
  StackSym **ppSVar3;
  StackSym *pSVar4;
  long lVar5;
  code *pcVar6;
  RegSlot RVar7;
  BVSparse<Memory::JitArenaAllocator> *pBVar8;
  undefined4 *puVar9;
  StackSym *pSVar10;
  Func *pFVar11;
  Type_conflict pBVar12;
  bool bVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  
  bVar16 = instr->m_kind == InstrKindByteCodeUses;
  bVar17 = instr->m_opcode == ByteCodeUses;
  bVar13 = bVar17 && bVar16;
  if (!bVar17 || !bVar16) {
    return bVar13;
  }
  PVar1 = this->tag;
  if (PVar1 == CaptureByteCodeRegUsePhase) {
    ProcessByteCodeUsesDst(this,(ByteCodeUsesInstr *)instr);
    ProcessByteCodeUsesSrcs(this,(ByteCodeUsesInstr *)instr);
    return bVar13;
  }
  if (PVar1 != DeadStorePhase) {
    if (PVar1 == BackwardPhase) {
      pBVar8 = ProcessByteCodeUsesSrcs(this,(ByteCodeUsesInstr *)instr);
      if (pBVar8 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        return bVar13;
      }
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                (this->currentBlock->upwardExposedUses,pBVar8);
      return bVar13;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar16 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                        ,0x815,"(tag == Js::DeadStorePhase)","tag == Js::DeadStorePhase");
    if (!bVar16) goto LAB_003de945;
    *puVar9 = 0;
  }
  if (instr->m_opcode != ByteCodeUses) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar16 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                        ,0x816,"(instr->m_opcode == Js::OpCode::ByteCodeUses)",
                        "instr->m_opcode == Js::OpCode::ByteCodeUses");
    if (!bVar16) {
LAB_003de945:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar9 = 0;
  }
  if (((this->tag == DeadStorePhase) && (bVar16 = SatisfyMarkTempObjectsConditions(this), bVar16))
     && (((this->currentBlock->field_0x18 & 2) != 0 || ((this->func->field_0x240 & 0x10) == 0)))) {
    if (this->isCollectionPass == true) {
      if ((this->func->field_0x240 & 0x10) == 0) {
        return bVar13;
      }
    }
    else {
      ObjectTempVerify::NotifyDeadByteCodeUses
                (&this->currentBlock->tempObjectVerifyTracker->super_ObjectTempVerify,instr);
    }
  }
  if ((this->func->field_0x240 & 0x10) != 0) {
    pSVar10 = ProcessByteCodeUsesDst(this,(ByteCodeUsesInstr *)instr);
    if ((pSVar10 != (StackSym *)0x0) &&
       (pFVar11 = StackSym::GetByteCodeFunc(pSVar10), pFVar11 == this->func)) {
      ppSVar3 = this->currentBlock->byteCodeRestoreSyms;
      RVar7 = StackSym::GetByteCodeRegSlot(pSVar10);
      ppSVar3[RVar7] = (StackSym *)0x0;
    }
    pBVar8 = ProcessByteCodeUsesSrcs(this,(ByteCodeUsesInstr *)instr);
    if ((pBVar8 != (BVSparse<Memory::JitArenaAllocator> *)0x0) &&
       (pBVar12 = pBVar8->head, pBVar12 != (Type_conflict)0x0)) {
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        uVar14 = (pBVar12->data).word;
        if (uVar14 != 0) {
          TVar2 = pBVar12->startIndex;
          uVar15 = 0;
          if (uVar14 != 0) {
            for (; (uVar14 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
            }
          }
          do {
            BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar15);
            pSVar10 = SymTable::FindStackSym(this->func->m_symTable,(BVIndex)uVar15 + TVar2);
            if ((pSVar10->field_0x1a & 1) != 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              bVar16 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                  ,0x83e,"(!stackSym->IsTypeSpec())","!stackSym->IsTypeSpec()");
              if (!bVar16) goto LAB_003de945;
              *puVar9 = 0;
            }
            pFVar11 = StackSym::GetByteCodeFunc(pSVar10);
            if (pFVar11 == this->func) {
              RVar7 = StackSym::GetByteCodeRegSlot(pSVar10);
              if (RVar7 == 0xffffffff) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar9 = 1;
                bVar16 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                    ,0x843,"(byteCodeRegSlot != Js::Constants::NoRegister)",
                                    "byteCodeRegSlot != Js::Constants::NoRegister");
                if (!bVar16) goto LAB_003de945;
                *puVar9 = 0;
              }
              pSVar4 = this->currentBlock->byteCodeRestoreSyms[RVar7];
              if (pSVar4 != pSVar10) {
                if (pSVar4 != (StackSym *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar9 = 1;
                  bVar16 = Js::Throw::ReportAssert
                                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                      ,0x847,
                                      "(this->currentBlock->byteCodeRestoreSyms[byteCodeRegSlot] == nullptr)"
                                      ,
                                      "Can\'t have two active lifetime for the same byte code register"
                                     );
                  if (!bVar16) goto LAB_003de945;
                  *puVar9 = 0;
                }
                this->currentBlock->byteCodeRestoreSyms[RVar7] = pSVar10;
              }
            }
            uVar14 = uVar14 & ~(1L << (uVar15 & 0x3f));
            lVar5 = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
              }
            }
            uVar15 = (ulong)(-(uint)(uVar14 == 0) | (uint)lVar5);
          } while (uVar14 != 0);
        }
        pBVar12 = pBVar12->next;
      } while (pBVar12 != (Type)0x0);
    }
    if (this->isCollectionPass != false) {
      return bVar13;
    }
    if ((*(long *)&instr[1].m_noLazyHelperAssert != 0) &&
       ((this->currentBlock->field_0x18 & 2) == 0)) {
      BVSparse<Memory::JitArenaAllocator>::Set
                (this->currentBlock->upwardExposedFields,
                 *(BVIndex *)(*(long *)&instr[1].m_noLazyHelperAssert + 0x10));
    }
    if (this->currentPrePassLoop != (Loop *)0x0) {
      return bVar13;
    }
  }
  BasicBlock::RemoveInstr(this->currentBlock,instr);
  return bVar13;
}

Assistant:

bool
BackwardPass::ProcessByteCodeUsesInstr(IR::Instr * instr)
{
    if (!instr->IsByteCodeUsesInstr())
    {
        return false;
    }

    IR::ByteCodeUsesInstr * byteCodeUsesInstr = instr->AsByteCodeUsesInstr();

    if (this->tag == Js::BackwardPhase)
    {
        // FGPeeps inserts bytecodeuses instrs with srcs.  We need to look at them to set the proper
        // UpwardExposedUsed info and keep the defs alive.
        // The inliner inserts bytecodeuses instrs withs dsts, but we don't want to look at them for upwardExposedUsed
        // as it would cause real defs to look dead.  We use these for bytecodeUpwardExposedUsed info only, which is needed
        // in the dead-store pass only.
        //
        // Handle the source side.
        const BVSparse<JitArenaAllocator>* byteCodeUpwardExposedUsed = ProcessByteCodeUsesSrcs(byteCodeUsesInstr);
        if (byteCodeUpwardExposedUsed != nullptr)
        {
            this->currentBlock->upwardExposedUses->Or(byteCodeUpwardExposedUsed);
        }
    }
#if DBG
    else if (tag == Js::CaptureByteCodeRegUsePhase)
    {
        ProcessByteCodeUsesDst(byteCodeUsesInstr);
        ProcessByteCodeUsesSrcs(byteCodeUsesInstr);
    }
#endif
    else
    {
        Assert(tag == Js::DeadStorePhase);
        Assert(instr->m_opcode == Js::OpCode::ByteCodeUses);
#if DBG
        if (this->DoMarkTempObjectVerify() && (this->currentBlock->isDead || !this->func->hasBailout))
        {
            if (IsCollectionPass())
            {
                if (!this->func->hasBailout)
                {
                    // Prevent byte code uses from being remove on collection pass for mark temp object verify
                    // if we don't have any bailout
                    return true;
                }
            }
            else
            {
                this->currentBlock->tempObjectVerifyTracker->NotifyDeadByteCodeUses(instr);
            }
        }
#endif

        if (this->func->hasBailout)
        {
            // Just collect the byte code uses, and remove the instruction
            // We are going backward, process the dst first and then the src
            StackSym *dstStackSym = ProcessByteCodeUsesDst(byteCodeUsesInstr);
#if DBG
            // We can only track first level function stack syms right now
            if (dstStackSym && dstStackSym->GetByteCodeFunc() == this->func)
            {
                this->currentBlock->byteCodeRestoreSyms[dstStackSym->GetByteCodeRegSlot()] = nullptr;
            }
#endif

            const BVSparse<JitArenaAllocator>* byteCodeUpwardExposedUsed = ProcessByteCodeUsesSrcs(byteCodeUsesInstr);
#if DBG
            if (byteCodeUpwardExposedUsed)
            {
                FOREACH_BITSET_IN_SPARSEBV(symId, byteCodeUpwardExposedUsed)
                {
                    StackSym * stackSym = this->func->m_symTable->FindStackSym(symId);
                    Assert(!stackSym->IsTypeSpec());
                    // We can only track first level function stack syms right now
                    if (stackSym->GetByteCodeFunc() == this->func)
                    {
                        Js::RegSlot byteCodeRegSlot = stackSym->GetByteCodeRegSlot();
                        Assert(byteCodeRegSlot != Js::Constants::NoRegister);
                        if (this->currentBlock->byteCodeRestoreSyms[byteCodeRegSlot] != stackSym)
                        {
                            AssertMsg(this->currentBlock->byteCodeRestoreSyms[byteCodeRegSlot] == nullptr,
                                "Can't have two active lifetime for the same byte code register");
                            this->currentBlock->byteCodeRestoreSyms[byteCodeRegSlot] = stackSym;
                        }
                    }
                }
                NEXT_BITSET_IN_SPARSEBV;
            }
#endif

            if (IsCollectionPass())
            {
                return true;
            }

            PropertySym *propertySymUse = byteCodeUsesInstr->propertySymUse;
            if (propertySymUse && !this->currentBlock->isDead)
            {
                this->currentBlock->upwardExposedFields->Set(propertySymUse->m_id);
            }

            if (this->IsPrePass())
            {
                // Don't remove the instruction yet if we are in the prepass
                // But tell the caller we don't need to process the instruction any more
                return true;
            }
        }

        this->currentBlock->RemoveInstr(instr);
    }